

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
fasthuf_decode(_internal_exr_context *pctxt,FastHufDecoder *fhd,uint8_t *src,int numSrcBits,
              uint16_t *dst,int numDstElems)

{
  uint16_t uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  ulong *puVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint in_R11D;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar41 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int local_6c;
  int local_5c;
  long lVar22;
  
  puVar10 = (ulong *)(src + 0x10);
  local_6c = numSrcBits + -0x80;
  uVar16 = *(ulong *)src;
  uVar17 = *(ulong *)(src + 8);
  uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18
           | (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18
           | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
  uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18
           | (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18
           | (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
  local_5c = 0x40;
  uVar14 = 0;
  iVar13 = 0x40;
  auVar47 = _DAT_0017c5c0;
  do {
    if (numDstElems <= (int)uVar14) {
      if (local_6c == 0) {
        return 0;
      }
      if (pctxt == (_internal_exr_context *)0x0) {
        return 0x17;
      }
      (*pctxt->print_error)
                (pctxt,0x17,
                 "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                );
      return 0x17;
    }
    if (uVar16 < fhd->_tableMin) {
      lVar9 = -0x32;
      do {
        lVar22 = lVar9;
        lVar9 = lVar22 + 1;
      } while (uVar16 < fhd->_ljOffset[lVar22 + 5]);
      uVar12 = lVar22 + 0x41;
      if (fhd->_maxCodeLength < uVar12) {
        if (pctxt == (_internal_exr_context *)0x0) {
          bVar2 = false;
        }
        else {
          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Decoded an invalid symbol)");
          bVar2 = false;
          auVar47 = _DAT_0017c5c0;
        }
      }
      else {
        uVar15 = (uVar16 >> (-(char)(lVar22 + 1) & 0x3fU)) +
                 *(long *)(fhd->_lookupSymbol + lVar22 * 2 + 0xc);
        iVar11 = fhd->_numSymbols;
        if (uVar15 < (ulong)(long)iVar11) {
          in_R11D = fhd->_idToSymbol[uVar15];
        }
        else if (pctxt != (_internal_exr_context *)0x0) {
          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Decoded an invalid symbol)");
          auVar47 = _DAT_0017c5c0;
        }
        if (uVar15 < (ulong)(long)iVar11) goto LAB_0010b9a3;
        bVar2 = false;
      }
    }
    else {
      uVar12 = (ulong)(uint)(fhd->_lookupSymbol[uVar16 >> 0x32] >> 0x18);
      in_R11D = fhd->_lookupSymbol[uVar16 >> 0x32] & 0xffffff;
LAB_0010b9a3:
      uVar16 = uVar16 << ((byte)uVar12 & 0x3f);
      iVar13 = iVar13 - (int)uVar12;
      if (in_R11D == fhd->_rleSymbol) {
        if (iVar13 < 8) {
          iVar11 = 0x40 - iVar13;
          uVar16 = uVar17 >> ((byte)iVar13 & 0x3f) | uVar16;
          iVar13 = iVar11 - local_5c;
          if (iVar13 != 0 && local_5c <= iVar11) {
            if (local_6c < 0x40) {
              if (local_6c < 1) {
                uVar17 = 0;
              }
              else {
                bVar7 = 0x38;
                uVar17 = 0;
                iVar11 = local_6c;
                do {
                  uVar17 = uVar17 | (ulong)(byte)*puVar10 << (bVar7 & 0x3f);
                  puVar10 = (ulong *)((long)puVar10 + 1);
                  bVar7 = bVar7 - 8;
                  local_6c = iVar11 + -8;
                  bVar2 = 8 < iVar11;
                  iVar11 = local_6c;
                } while (bVar2);
              }
              if (local_6c < 1) {
                local_6c = 0;
              }
            }
            else {
              uVar17 = *puVar10;
              uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                       (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                       (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                       (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
              puVar10 = puVar10 + 1;
              local_6c = local_6c + -0x40;
            }
            uVar16 = uVar16 | uVar17 >> (-(char)iVar13 & 0x3fU);
            local_5c = 0x40;
            iVar11 = iVar13;
          }
          uVar17 = uVar17 << ((byte)iVar11 & 0x3f);
          if (local_5c - iVar11 == 0 || local_5c < iVar11) {
            uVar17 = 0;
          }
          iVar13 = 0x40;
          local_5c = local_5c - iVar11;
        }
        if ((int)uVar14 < 1) {
          if (pctxt != (_internal_exr_context *)0x0) {
            pcVar8 = "Huffman decode error (RLE code with no previous symbol)";
            goto LAB_0010bb8d;
          }
LAB_0010bbcd:
          bVar2 = false;
          uVar6 = uVar14;
        }
        else {
          bVar7 = (byte)(uVar16 >> 0x38);
          uVar6 = uVar14 + bVar7;
          if (numDstElems < (int)uVar6) {
            if (pctxt == (_internal_exr_context *)0x0) goto LAB_0010bbcd;
            pcVar8 = "Huffman decode error (Symbol run beyond expected output buffer length)";
          }
          else {
            if (uVar16 >> 0x38 != 0) {
              lVar9 = (uVar16 >> 0x38) - 1;
              auVar18._8_4_ = (int)lVar9;
              auVar18._0_8_ = lVar9;
              auVar18._12_4_ = (int)((ulong)lVar9 >> 0x20);
              lVar9 = (ulong)uVar14 * 2;
              auVar18 = auVar18 ^ auVar47;
              uVar12 = 0;
              auVar21 = _DAT_0017c5b0;
              auVar23 = _DAT_0017c5a0;
              auVar24 = _DAT_0017c590;
              auVar25 = _DAT_0017c580;
              do {
                auVar26 = auVar21 ^ auVar47;
                iVar11 = auVar18._0_4_;
                iVar39 = -(uint)(iVar11 < auVar26._0_4_);
                iVar19 = auVar18._4_4_;
                auVar27._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
                iVar43 = auVar18._8_4_;
                iVar42 = -(uint)(iVar43 < auVar26._8_4_);
                iVar20 = auVar18._12_4_;
                auVar27._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
                auVar36._4_4_ = iVar39;
                auVar36._0_4_ = iVar39;
                auVar36._8_4_ = iVar42;
                auVar36._12_4_ = iVar42;
                auVar44 = pshuflw(in_XMM8,auVar36,0xe8);
                auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
                auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar46 = pshuflw(in_XMM9,auVar29,0xe8);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar45 = pshuflw(auVar44,auVar27,0xe8);
                auVar26._8_4_ = 0xffffffff;
                auVar26._0_8_ = 0xffffffffffffffff;
                auVar26._12_4_ = 0xffffffff;
                auVar26 = (auVar45 | auVar46 & auVar44) ^ auVar26;
                auVar26 = packssdw(auVar26,auVar26);
                uVar1 = dst[(ulong)uVar14 - 1];
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9) = uVar1;
                }
                auVar27 = auVar29 & auVar36 | auVar27;
                auVar26 = packssdw(auVar27,auVar27);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar45,auVar26 ^ auVar45);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 2) = uVar1;
                }
                auVar26 = auVar23 ^ auVar47;
                iVar39 = -(uint)(iVar11 < auVar26._0_4_);
                auVar40._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
                iVar42 = -(uint)(iVar43 < auVar26._8_4_);
                auVar40._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
                auVar28._4_4_ = iVar39;
                auVar28._0_4_ = iVar39;
                auVar28._8_4_ = iVar42;
                auVar28._12_4_ = iVar42;
                auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
                auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar26 = auVar35 & auVar28 | auVar40;
                auVar26 = packssdw(auVar26,auVar26);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar4,auVar26 ^ auVar4);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 4) = uVar1;
                }
                auVar29 = pshufhw(auVar28,auVar28,0x84);
                auVar36 = pshufhw(auVar35,auVar35,0x84);
                auVar27 = pshufhw(auVar29,auVar40,0x84);
                auVar30._8_4_ = 0xffffffff;
                auVar30._0_8_ = 0xffffffffffffffff;
                auVar30._12_4_ = 0xffffffff;
                auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 6) = uVar1;
                }
                auVar29 = auVar24 ^ auVar47;
                iVar39 = -(uint)(iVar11 < auVar29._0_4_);
                auVar32._4_4_ = -(uint)(iVar19 < auVar29._4_4_);
                iVar42 = -(uint)(iVar43 < auVar29._8_4_);
                auVar32._12_4_ = -(uint)(iVar20 < auVar29._12_4_);
                auVar37._4_4_ = iVar39;
                auVar37._0_4_ = iVar39;
                auVar37._8_4_ = iVar42;
                auVar37._12_4_ = iVar42;
                auVar26 = pshuflw(auVar26,auVar37,0xe8);
                auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar19);
                auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar20);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar29 = pshuflw(auVar46 & auVar44,auVar31,0xe8);
                in_XMM9 = auVar29 & auVar26;
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar26 = pshuflw(auVar26,auVar32,0xe8);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar44 = (auVar26 | in_XMM9) ^ auVar44;
                auVar26 = packssdw(auVar44,auVar44);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 8) = uVar1;
                }
                auVar32 = auVar31 & auVar37 | auVar32;
                auVar26 = packssdw(auVar32,auVar32);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 10) = uVar1;
                }
                auVar26 = auVar25 ^ auVar47;
                iVar11 = -(uint)(iVar11 < auVar26._0_4_);
                auVar41._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
                iVar43 = -(uint)(iVar43 < auVar26._8_4_);
                auVar41._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
                auVar33._4_4_ = iVar11;
                auVar33._0_4_ = iVar11;
                auVar33._8_4_ = iVar43;
                auVar33._12_4_ = iVar43;
                auVar38._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
                auVar38._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar26 = auVar38 & auVar33 | auVar41;
                auVar26 = packssdw(auVar26,auVar26);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar26 ^ auVar5,auVar26 ^ auVar5);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 0xc) = uVar1;
                }
                auVar26 = pshufhw(auVar33,auVar33,0x84);
                auVar27 = pshufhw(auVar38,auVar38,0x84);
                auVar29 = pshufhw(auVar26,auVar41,0x84);
                auVar34._8_4_ = 0xffffffff;
                auVar34._0_8_ = 0xffffffffffffffff;
                auVar34._12_4_ = 0xffffffff;
                auVar34 = (auVar29 | auVar27 & auVar26) ^ auVar34;
                auVar26 = packssdw(auVar34,auVar34);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar12 + lVar9 + 0xe) = uVar1;
                }
                lVar22 = auVar21._8_8_;
                auVar21._0_8_ = auVar21._0_8_ + 8;
                auVar21._8_8_ = lVar22 + 8;
                lVar22 = auVar23._8_8_;
                auVar23._0_8_ = auVar23._0_8_ + 8;
                auVar23._8_8_ = lVar22 + 8;
                lVar22 = auVar24._8_8_;
                auVar24._0_8_ = auVar24._0_8_ + 8;
                auVar24._8_8_ = lVar22 + 8;
                lVar22 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + 8;
                auVar25._8_8_ = lVar22 + 8;
                uVar12 = uVar12 + 0x10;
              } while (((uint)bVar7 * 2 + 0xe & 0xfffffff0) != uVar12);
              uVar16 = uVar16 << 8;
              iVar13 = iVar13 + -8;
              bVar2 = true;
              goto LAB_0010be6f;
            }
            if (pctxt == (_internal_exr_context *)0x0) goto LAB_0010bbcd;
            pcVar8 = "Huffman decode error (Invalid RLE length)";
          }
LAB_0010bb8d:
          bVar2 = false;
          (*pctxt->print_error)(pctxt,0x17,pcVar8);
          auVar47 = _DAT_0017c5c0;
          uVar6 = uVar14;
        }
LAB_0010be6f:
        if (!bVar2) {
          bVar2 = false;
          uVar14 = uVar6;
          goto LAB_0010bf4d;
        }
      }
      else {
        dst[(int)uVar14] = (uint16_t)in_R11D;
        uVar6 = uVar14 + 1;
      }
      bVar2 = true;
      uVar14 = uVar6;
      if (iVar13 < 0x40) {
        iVar11 = 0x40 - iVar13;
        uVar16 = uVar17 >> ((byte)iVar13 & 0x3f) | uVar16;
        iVar13 = iVar11 - local_5c;
        if (iVar13 != 0 && local_5c <= iVar11) {
          if (local_6c < 0x40) {
            if (local_6c < 1) {
              uVar17 = 0;
            }
            else {
              bVar7 = 0x38;
              uVar17 = 0;
              iVar11 = local_6c;
              do {
                uVar17 = uVar17 | (ulong)(byte)*puVar10 << (bVar7 & 0x3f);
                puVar10 = (ulong *)((long)puVar10 + 1);
                bVar7 = bVar7 - 8;
                local_6c = iVar11 + -8;
                bVar3 = 8 < iVar11;
                iVar11 = local_6c;
              } while (bVar3);
            }
            if (local_6c < 1) {
              local_6c = 0;
            }
          }
          else {
            uVar17 = *puVar10;
            uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                     (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                     (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                     (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
            puVar10 = puVar10 + 1;
            local_6c = local_6c + -0x40;
          }
          uVar16 = uVar16 | uVar17 >> (-(char)iVar13 & 0x3fU);
          local_5c = 0x40;
          iVar11 = iVar13;
        }
        uVar17 = uVar17 << ((byte)iVar11 & 0x3f);
        if (local_5c - iVar11 == 0 || local_5c < iVar11) {
          uVar17 = 0;
        }
        iVar13 = 0x40;
        local_5c = local_5c - iVar11;
      }
    }
LAB_0010bf4d:
    if (!bVar2) {
      return 0x17;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    const struct _internal_exr_context* pctxt,
    FastHufDecoder*                     fhd,
    const uint8_t*                      src,
    int                                 numSrcBits,
    uint16_t*                           dst,
    int                                 numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char* currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    uint64_t buffer        = READ64 (src);
    int      bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    uint64_t bufferBack        = READ64 ((src + sizeof (uint64_t)));
    int      bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int codeLen;
        int symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (fhd->_tableMin <= buffer)
        {
            int tableIdx =
                fhd->_lookupSymbol[buffer >> (64 - TABLE_LOOKUP_BITS)];

            //
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = tableIdx >> 24;
            symbol  = tableIdx & 0xffffff;
        }
        else
        {
            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            while (fhd->_ljBase[codeLen] >
                   buffer /* && codeLen <= _maxCodeLength */)
                codeLen++;

            if (codeLen > fhd->_maxCodeLength)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            uint64_t id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < (uint64_t) fhd->_numSymbols)
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == fhd->_rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    64 - bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (dstIdx + rleCount > numDstElems)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (rleCount <= 0)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < 64)
        {
            FastHufDecoder_refill (
                &buffer,
                64 - bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}